

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void findConstInWhere(WhereConst *pConst,Expr *pExpr)

{
  Expr *pExpr_00;
  Expr *pColumn;
  long in_FS_OFFSET;
  Walker local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    if ((pExpr == (Expr *)0x0) || ((pExpr->flags & pConst->mExcludeOn) != 0)) goto LAB_001934d6;
    if (pExpr->op != ',') break;
    findConstInWhere(pConst,pExpr->pRight);
    pExpr = pExpr->pLeft;
  }
  if (pExpr->op == '6') {
    pExpr_00 = pExpr->pLeft;
    pColumn = pExpr->pRight;
    if (pColumn->op == 0xa8) {
      local_68.pParse = pConst->pParse;
      local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.walkerDepth = -0x55555556;
      local_68.eCode = 1;
      local_68.mWFlags = 0xaaaa;
      local_68.xExprCallback = exprNodeIsConstant;
      local_68.xSelectCallback = sqlite3SelectWalkFail;
      if (pExpr_00 != (Expr *)0x0) {
        sqlite3WalkExprNN(&local_68,pExpr_00);
      }
      if (local_68.eCode != 0) {
        constInsert(pConst,pColumn,pExpr_00,pExpr);
      }
    }
    if (pExpr_00->op == 0xa8) {
      local_68.pParse = pConst->pParse;
      local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.walkerDepth = -0x55555556;
      local_68.eCode = 1;
      local_68.mWFlags = 0xaaaa;
      local_68.xExprCallback = exprNodeIsConstant;
      local_68.xSelectCallback = sqlite3SelectWalkFail;
      sqlite3WalkExprNN(&local_68,pColumn);
      if (local_68.eCode != 0) {
        constInsert(pConst,pExpr_00,pColumn,pExpr);
      }
    }
  }
LAB_001934d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void findConstInWhere(WhereConst *pConst, Expr *pExpr){
  Expr *pRight, *pLeft;
  if( NEVER(pExpr==0) ) return;
  if( ExprHasProperty(pExpr, pConst->mExcludeOn) ){
    testcase( ExprHasProperty(pExpr, EP_OuterON) );
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    return;
  }
  if( pExpr->op==TK_AND ){
    findConstInWhere(pConst, pExpr->pRight);
    findConstInWhere(pConst, pExpr->pLeft);
    return;
  }
  if( pExpr->op!=TK_EQ ) return;
  pRight = pExpr->pRight;
  pLeft = pExpr->pLeft;
  assert( pRight!=0 );
  assert( pLeft!=0 );
  if( pRight->op==TK_COLUMN && sqlite3ExprIsConstant(pConst->pParse, pLeft) ){
    constInsert(pConst,pRight,pLeft,pExpr);
  }
  if( pLeft->op==TK_COLUMN && sqlite3ExprIsConstant(pConst->pParse, pRight) ){
    constInsert(pConst,pLeft,pRight,pExpr);
  }
}